

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O2

double ** __thiscall
Atmosphere::tabulate(Atmosphere *this,double h_start,double h_end,double h_step)

{
  uint uVar1;
  double **ppdVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  array<double,_3UL> local_48;
  
  uVar1 = (uint)((h_end - h_start) / h_step + 1.0);
  uVar8 = 0;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar5 = (long)(int)uVar1 * 8;
  }
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar8;
  }
  ppdVar2 = (double **)operator_new__(uVar5);
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    pdVar3 = (double *)operator_new__(0x20);
    ppdVar2[uVar8] = pdVar3;
  }
  local_48._M_elems[0] = 0.0;
  local_48._M_elems[1] = 0.0;
  local_48._M_elems[2] = 0.0;
  lVar7 = 0;
  for (; h_start <= h_end; h_start = h_start + h_step) {
    calculate(&local_48,this,h_start);
    pdVar3 = ppdVar2[lVar7];
    *pdVar3 = h_start;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      pdVar3[lVar4 + 1] = local_48._M_elems[lVar4];
    }
    lVar7 = lVar7 + 1;
  }
  return ppdVar2;
}

Assistant:

double **tabulate(double h_start, double h_end, double h_step) {

        const int size = (const int) ((h_end - h_start) / h_step + 1);
        auto **result = new double *[size];
        for (int i = 0; i < size; ++i) {
            result[i] = new double[4];
        }

        std::array<double, 3> temp{};

        int i = 0, j = 0;
        double h = h_start;
        while (h <= h_end) {
            temp = this->calculate(h);
            result[i][0] = h;
            for (j = 0; j < 3; j++) {
                result[i][j + 1] = temp[j];
            }
            h += h_step;
            i++;
        }
        return result;
    }